

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

char * libssh2_hostkey_hash(LIBSSH2_SESSION *session,int hash_type)

{
  LIBSSH2_SESSION *local_30;
  LIBSSH2_SESSION *local_28;
  int hash_type_local;
  LIBSSH2_SESSION *session_local;
  
  if (hash_type == 1) {
    if (session->server_hostkey_md5_valid == 0) {
      local_28 = (LIBSSH2_SESSION *)0x0;
    }
    else {
      local_28 = (LIBSSH2_SESSION *)session->server_hostkey_md5;
    }
    session_local = local_28;
  }
  else if (hash_type == 2) {
    if (session->server_hostkey_sha1_valid == 0) {
      local_30 = (LIBSSH2_SESSION *)0x0;
    }
    else {
      local_30 = (LIBSSH2_SESSION *)session->server_hostkey_sha1;
    }
    session_local = local_30;
  }
  else {
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  return (char *)session_local;
}

Assistant:

LIBSSH2_API const char *
libssh2_hostkey_hash(LIBSSH2_SESSION * session, int hash_type)
{
    switch (hash_type) {
#if LIBSSH2_MD5
    case LIBSSH2_HOSTKEY_HASH_MD5:
        return (session->server_hostkey_md5_valid)
          ? (char *) session->server_hostkey_md5
          : NULL;
        break;
#endif /* LIBSSH2_MD5 */
    case LIBSSH2_HOSTKEY_HASH_SHA1:
        return (session->server_hostkey_sha1_valid)
          ? (char *) session->server_hostkey_sha1
          : NULL;
        break;
    default:
        return NULL;
    }
}